

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall spvtools::opt::Instruction::ClearDbgLineInsts(Instruction *this)

{
  pointer pIVar1;
  DefUseManager *this_00;
  Instruction *l_inst;
  pointer inst;
  
  if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    pIVar1 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (inst = (this->dbg_line_insts_).
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start; inst != pIVar1; inst = inst + 1) {
      analysis::DefUseManager::ClearInst(this_00,inst);
    }
  }
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::clear
            (&this->dbg_line_insts_);
  return;
}

Assistant:

void Instruction::ClearDbgLineInsts() {
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse)) {
    auto def_use_mgr = context()->get_def_use_mgr();
    for (auto& l_inst : dbg_line_insts_) def_use_mgr->ClearInst(&l_inst);
  }
  clear_dbg_line_insts();
}